

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_sequencer.h
# Opt level: O2

bool __thiscall draco::LinearSequencer::GenerateSequenceInternal(LinearSequencer *this)

{
  int iVar1;
  reference pvVar2;
  int i;
  size_type __n;
  
  iVar1 = this->num_points_;
  if (-1 < (long)iVar1) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::resize((this->super_PointsSequencer).out_point_ids_,(long)iVar1);
    for (__n = 0; (long)__n < (long)this->num_points_; __n = __n + 1) {
      pvVar2 = std::
               vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
               ::at((this->super_PointsSequencer).out_point_ids_,__n);
      pvVar2->value_ = (uint)__n;
    }
  }
  return -1 < iVar1;
}

Assistant:

bool GenerateSequenceInternal() override {
    if (num_points_ < 0) {
      return false;
    }
    out_point_ids()->resize(num_points_);
    for (int i = 0; i < num_points_; ++i) {
      out_point_ids()->at(i) = PointIndex(i);
    }
    return true;
  }